

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

string * __thiscall Node::Paren_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  allocator local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->Type == 0x2d) || (this->Type == 0x2b)) {
    std::__cxx11::string::string((string *)&local_50,"(",&local_71);
    Expression_abi_cxx11_(&local_70,this);
    std::operator+(&local_30,&local_50,&local_70);
    std::operator+(__return_storage_ptr__,&local_30,")");
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    Expression_abi_cxx11_(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Node::Paren(void)
{
	switch(Type)
	{
	// Add other operations as needed
	case '+':
	case '-':
		return std::string("(") + Expression() + ")";

//	case  '(':
	default:
		return Expression();
	}
}